

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O3

wchar_t detect_form(archive_read *a,wchar_t *is_form_d)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  wchar_t wVar4;
  byte *b;
  ulong uVar5;
  void *pvVar6;
  void *pvVar7;
  ssize_t sVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  byte bVar13;
  ulong uVar14;
  byte *p;
  byte *pbVar15;
  ulong uVar16;
  bool bVar17;
  ssize_t avail;
  ssize_t nl;
  int local_64;
  int local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  archive_read *local_40;
  wchar_t *local_38;
  
  if (is_form_d != (wchar_t *)0x0) {
    *is_form_d = L'\0';
  }
  local_40 = a;
  b = (byte *)__archive_read_ahead(a,1,(ssize_t *)&local_58);
  if (b == (byte *)0x0) {
    wVar4 = L'\xffffffff';
  }
  else {
    local_60 = 0;
    cVar2 = '\0';
    local_64 = 0;
    uVar12 = local_58;
    local_38 = is_form_d;
LAB_0013de3b:
    uVar16 = local_58;
    if (local_58 == 0) {
      local_48 = 0;
      uVar5 = 0;
LAB_0013de76:
      uVar9 = uVar16;
      if (uVar5 == uVar16) {
        while( true ) {
          if (0xfffff < (long)uVar9) {
            uVar5 = 1;
            goto LAB_0013e2ed;
          }
          uVar16 = (ulong)((int)uVar12 + 0x3ffU & 0xfffffc00);
          pvVar6 = __archive_read_ahead
                             (local_40,uVar16 << (uVar16 < uVar12 + 0xa0),(ssize_t *)&local_58);
          pvVar7 = pvVar6;
          if (pvVar6 == (void *)0x0) {
            if ((long)local_58 <= (long)uVar12) {
              uVar5 = 0;
              goto LAB_0013e2ed;
            }
            pvVar7 = __archive_read_ahead(local_40,local_58,(ssize_t *)&local_58);
          }
          uVar14 = local_58;
          uVar16 = local_58 - (uVar12 - uVar9);
          local_58 = uVar16;
          sVar8 = get_line_size((char *)((long)pvVar7 + uVar12),uVar16 - uVar9,(ssize_t *)&local_48)
          ;
          uVar5 = 0;
          if (-1 < sVar8) {
            uVar5 = uVar9;
          }
          uVar5 = uVar5 + sVar8;
          if (local_48 != 0) break;
          if ((pvVar6 == (void *)0x0) || (uVar12 = uVar14, uVar9 = uVar16, uVar5 != uVar16))
          goto LAB_0013e2ed;
        }
        b = (byte *)((long)pvVar7 + (uVar12 - uVar9));
        local_50 = uVar14;
        uVar12 = local_50;
        goto LAB_0013df4a;
      }
    }
    else {
      uVar5 = get_line_size((char *)b,local_58,(ssize_t *)&local_48);
      if (local_48 == 0) goto LAB_0013de76;
LAB_0013df4a:
      local_50 = uVar12;
      uVar12 = local_48;
      if ((long)uVar5 < 1) goto LAB_0013e2ed;
      if (cVar2 != '\0') {
        wVar4 = bid_keyword_list((char *)b,uVar5,L'\0',L'\0');
        if (wVar4 < L'\x01') {
LAB_0013e329:
          uVar5 = 1;
          goto LAB_0013e2ed;
        }
        b = b + uVar5;
        if ((b[~uVar12] != 0x5c) && (bVar17 = cVar2 == '\x01', cVar2 = '\0', bVar17)) {
          if (1 < local_60) goto LAB_0013e2ff;
          local_60 = local_60 + 1;
        }
        local_58 = uVar16 - uVar5;
        uVar12 = local_50;
        goto LAB_0013de3b;
      }
      pbVar15 = b + uVar5;
      do {
        bVar13 = *b;
        if ((bVar13 != 0x20) && (bVar13 != 9)) {
          bVar17 = true;
          goto LAB_0013dfa2;
        }
        b = b + 1;
        uVar16 = uVar16 - 1;
        bVar17 = 1 < (long)uVar5;
        uVar5 = uVar5 - 1;
        local_58 = uVar16;
      } while (bVar17);
      bVar13 = *pbVar15;
      uVar5 = 0;
      bVar17 = false;
      b = pbVar15;
LAB_0013dfa2:
      uVar9 = (ulong)bVar13;
      if (0x22 < bVar13) {
        if (bVar13 == 0x23) goto LAB_0013dfbe;
        if (bVar13 != 0x2f) goto LAB_0013e0a7;
        if (uVar5 < 5) goto LAB_0013e2ed;
        iVar3 = strncmp((char *)b,"/set",4);
        if (iVar3 == 0) {
          pbVar15 = b + 4;
          lVar11 = uVar5 - 4;
          wVar4 = L'\0';
        }
        else {
          if ((uVar5 < 7) || (iVar3 = strncmp((char *)b,"/unset",6), iVar3 != 0)) goto LAB_0013e329;
          pbVar15 = b + 6;
          lVar11 = uVar5 - 6;
          wVar4 = L'\x01';
        }
        wVar4 = bid_keyword_list((char *)pbVar15,lVar11,wVar4,L'\0');
        if (wVar4 < L'\x01') goto LAB_0013e329;
        cVar2 = (b[~uVar12 + uVar5] == 0x5c) * '\x02';
LAB_0013e2b7:
        b = b + uVar5;
        local_58 = uVar16 - uVar5;
        uVar12 = local_50;
        goto LAB_0013de3b;
      }
      if ((bVar13 == 10) || (bVar13 == 0xd)) {
LAB_0013dfbe:
        b = b + uVar5;
        local_58 = uVar16 - uVar5;
        uVar12 = local_50;
        goto LAB_0013de3b;
      }
LAB_0013e0a7:
      pbVar15 = b + uVar5;
      if (!bVar17) {
LAB_0013e111:
        lVar11 = -local_48;
        if ((((pbVar15 + lVar11 + -2 < b) || (pbVar15[lVar11 + -1] != 0x5c)) ||
            ((bVar13 = pbVar15[lVar11 + -2], bVar13 != 9 && (bVar13 != 0x20)))) &&
           ((b <= pbVar15 + lVar11 + -1 && (bVar13 = pbVar15[lVar11 + -1], bVar13 != 0x5c)))) {
          lVar11 = uVar5 - local_48;
          bVar17 = false;
          uVar10 = 0;
          while( true ) {
            if ((bVar13 == 9) || (bVar13 == 0x20)) goto LAB_0013e1f4;
            if (bid_entry_safe_char[bVar13] == '\0') goto LAB_0013e2ed;
            if (bVar13 == 0x2f) {
              bVar17 = true;
            }
            if (b + lVar11 + -2 < b) break;
            bVar13 = b[lVar11 + -2];
            lVar11 = lVar11 + -1;
            uVar10 = uVar10 + 1;
          }
          lVar11 = lVar11 + -1;
          uVar10 = uVar10 + 1;
LAB_0013e1f4:
          if (((uVar10 != 0) && (bVar17)) && (b[lVar11] != 0x2f)) {
            uVar14 = uVar5 - (uVar10 + local_48);
            wVar4 = L'\x01';
            bVar17 = false;
            p = b;
            goto LAB_0013e229;
          }
        }
        goto LAB_0013e2ed;
      }
      pcVar1 = bid_entry_safe_char + uVar9;
      p = b;
      uVar14 = uVar5;
      cVar2 = *pcVar1;
      while (cVar2 != '\0') {
        p = p + 1;
        uVar14 = uVar14 - 1;
        if (pbVar15 <= p) goto LAB_0013e1e5;
        uVar9 = (ulong)*p;
        cVar2 = bid_entry_safe_char[uVar9];
      }
      if (((0x20 < (byte)uVar9) || ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0)) || (*pcVar1 == '\0')
         ) goto LAB_0013e111;
      uVar14 = (long)pbVar15 - (long)p;
LAB_0013e1e5:
      wVar4 = L'\0';
      bVar17 = true;
LAB_0013e229:
      wVar4 = bid_keyword_list((char *)p,uVar14,L'\0',wVar4);
      if (L'\xffffffff' < wVar4) {
        if (local_64 == 1) {
          if ((bool)(bVar17 & wVar4 != L'\0')) {
            local_64 = 1;
            goto LAB_0013e2ed;
          }
LAB_0013e275:
          if (bVar17) {
LAB_0013e27a:
            cVar2 = '\x01';
            if (pbVar15[~uVar12] == 0x5c) goto LAB_0013e2b7;
          }
        }
        else {
          if (local_64 != 0) goto LAB_0013e275;
          local_64 = 1;
          if (bVar17) {
            local_64 = -(uint)(wVar4 != L'\0');
            goto LAB_0013e27a;
          }
        }
        if (local_60 < 2) {
          local_60 = local_60 + 1;
          cVar2 = '\0';
          goto LAB_0013e2b7;
        }
        goto LAB_0013e2ff;
      }
    }
LAB_0013e2ed:
    if (local_60 < 3) {
      if (local_60 < 1) {
        return L'\0';
      }
      if (uVar5 != 0) {
        return L'\0';
      }
    }
LAB_0013e2ff:
    wVar4 = L' ';
    if ((local_38 != (wchar_t *)0x0) && (local_64 == 1)) {
      *local_38 = L'\x01';
    }
  }
  return wVar4;
}

Assistant:

static int
detect_form(struct archive_read *a, int *is_form_d)
{
	const char *p;
	ssize_t avail, ravail;
	ssize_t len, nl;
	int entry_cnt = 0, multiline = 0;
	int form_D = 0;/* The archive is generated by `NetBSD mtree -D'
			* (In this source we call it `form D') . */

	if (is_form_d != NULL)
		*is_form_d = 0;
	p = __archive_read_ahead(a, 1, &avail);
	if (p == NULL)
		return (-1);
	ravail = avail;
	for (;;) {
		len = next_line(a, &p, &avail, &ravail, &nl);
		/* The terminal character of the line should be
		 * a new line character, '\r\n' or '\n'. */
		if (len <= 0 || nl == 0)
			break;
		if (!multiline) {
			/* Leading whitespace is never significant,
			 * ignore it. */
			while (len > 0 && (*p == ' ' || *p == '\t')) {
				++p;
				--avail;
				--len;
			}
			/* Skip comment or empty line. */ 
			if (p[0] == '#' || p[0] == '\n' || p[0] == '\r') {
				p += len;
				avail -= len;
				continue;
			}
		} else {
			/* A continuance line; the terminal
			 * character of previous line was '\' character. */
			if (bid_keyword_list(p, len, 0, 0) <= 0)
				break;
			if (p[len-nl-1] != '\\') {
				if (multiline == 1 &&
				    ++entry_cnt >= MAX_BID_ENTRY)
					break;
				multiline = 0;
			}
			p += len;
			avail -= len;
			continue;
		}
		if (p[0] != '/') {
			int last_is_path, keywords;

			keywords = bid_entry(p, len, nl, &last_is_path);
			if (keywords >= 0) {
				if (form_D == 0) {
					if (last_is_path)
						form_D = 1;
					else if (keywords > 0)
						/* This line is not `form D'. */
						form_D = -1;
				} else if (form_D == 1) {
					if (!last_is_path && keywords > 0)
						/* This this is not `form D'
						 * and We cannot accept mixed
						 * format. */
						break;
				}
				if (!last_is_path && p[len-nl-1] == '\\')
					/* This line continues. */
					multiline = 1;
				else {
					/* We've got plenty of correct lines
					 * to assume that this file is an mtree
					 * format. */
					if (++entry_cnt >= MAX_BID_ENTRY)
						break;
				}
			} else
				break;
		} else if (len > 4 && strncmp(p, "/set", 4) == 0) {
			if (bid_keyword_list(p+4, len-4, 0, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else if (len > 6 && strncmp(p, "/unset", 6) == 0) {
			if (bid_keyword_list(p+6, len-6, 1, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else
			break;

		/* Test next line. */
		p += len;
		avail -= len;
	}
	if (entry_cnt >= MAX_BID_ENTRY || (entry_cnt > 0 && len == 0)) {
		if (is_form_d != NULL) {
			if (form_D == 1)
				*is_form_d = 1;
		}
		return (32);
	}

	return (0);
}